

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O3

Mesh * vera::icosphereMesh(Mesh *__return_storage_ptr__,float _radius,size_t _iterations)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined8 uVar3;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar9;
  pointer pvVar10;
  pointer puVar11;
  Mesh *this;
  pointer pvVar12;
  ulong uVar13;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar14;
  ulong uVar15;
  iterator iVar16;
  ulong uVar17;
  ulong uVar18;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar19;
  pointer pvVar20;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 aVar21;
  size_t sVar22;
  long lVar23;
  bool bVar24;
  float fVar25;
  undefined1 auVar26 [8];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  iterator iVar28;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar27 [16];
  float fVar29;
  float fVar30;
  float fVar31;
  initializer_list<unsigned_int> __l;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  vertices;
  vector<int,_std::allocator<int>_> indexToSplit;
  uint32_t i1;
  uint32_t i2;
  uint32_t i3;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  texCoords;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  local_208;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_1e8;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aStack_1e4;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aStack_1e0;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aStack_1dc;
  vec<2,_float,_(glm::qualifier)0> local_1d8;
  float local_1d0;
  float local_1cc;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_1c8 [2];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_1c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1b8;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_198 [2];
  uint local_190;
  float local_18c;
  undefined1 local_188 [8];
  iterator iStack_180;
  pointer local_178;
  undefined1 local_98 [8];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  Mesh *local_88;
  size_t local_80;
  size_t local_78;
  ulong local_70;
  float local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_208.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._0_12_ = ZEXT812(0);
  local_208.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_208.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (vec<3,_float,_(glm::qualifier)0> *)0x0;
  local_188 = (undefined1  [8])0x3f59c440bf069650;
  iStack_180._M_current = iStack_180._M_current & 0xffffffff00000000;
  local_68 = _radius;
  std::
  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>::
  _M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
            ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              *)&local_208,(iterator)0x0,(vec<3,_float,_(glm::qualifier)0> *)local_188);
  local_188 = (undefined1  [8])0x3f59c4403f069650;
  iStack_180._M_current = iStack_180._M_current & 0xffffffff00000000;
  if (local_208.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_208.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_208,
               (iterator)
               local_208.
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (vec<3,_float,_(glm::qualifier)0> *)local_188);
    iVar16._M_current =
         local_208.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    ((local_208.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->field_2).z = 0.0;
    (local_208.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f069650;
    (local_208.
     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f59c440;
    iVar16._M_current =
         local_208.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    local_208.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar16._M_current;
  }
  local_188 = (undefined1  [8])0x3f06965000000000;
  iStack_180._M_current._0_4_ = -0.8506508;
  if (iVar16._M_current ==
      local_208.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_208,iVar16,(vec<3,_float,_(glm::qualifier)0> *)local_188);
    iVar16._M_current =
         local_208.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    ((iVar16._M_current)->field_2).z = -0.8506508;
    (iVar16._M_current)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    (iVar16._M_current)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f069650;
    iVar16._M_current =
         local_208.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    local_208.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar16._M_current;
  }
  local_188 = (undefined1  [8])0x3f06965000000000;
  iStack_180._M_current._0_4_ = 0.8506508;
  if (iVar16._M_current ==
      local_208.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_208,iVar16,(vec<3,_float,_(glm::qualifier)0> *)local_188);
    iVar16._M_current =
         local_208.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    ((iVar16._M_current)->field_2).z = 0.8506508;
    (iVar16._M_current)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    (iVar16._M_current)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f069650;
    iVar16._M_current =
         local_208.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    local_208.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar16._M_current;
  }
  local_188 = (undefined1  [8])0xbf59c440;
  iStack_180._M_current._0_4_ = -0.5257311;
  if (iVar16._M_current ==
      local_208.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_208,iVar16,(vec<3,_float,_(glm::qualifier)0> *)local_188);
    iVar16._M_current =
         local_208.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    ((iVar16._M_current)->field_2).z = -0.5257311;
    (iVar16._M_current)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbf59c440;
    (iVar16._M_current)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
    iVar16._M_current =
         local_208.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    local_208.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar16._M_current;
  }
  local_188 = (undefined1  [8])0xbf59c440;
  iStack_180._M_current._0_4_ = 0.5257311;
  if (iVar16._M_current ==
      local_208.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_208,iVar16,(vec<3,_float,_(glm::qualifier)0> *)local_188);
    iVar16._M_current =
         local_208.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    ((iVar16._M_current)->field_2).z = 0.5257311;
    (iVar16._M_current)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbf59c440;
    (iVar16._M_current)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
    iVar16._M_current =
         local_208.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    local_208.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar16._M_current;
  }
  local_188 = (undefined1  [8])0x3f59c440;
  iStack_180._M_current._0_4_ = -0.5257311;
  if (iVar16._M_current ==
      local_208.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_208,iVar16,(vec<3,_float,_(glm::qualifier)0> *)local_188);
    iVar16._M_current =
         local_208.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    ((iVar16._M_current)->field_2).z = -0.5257311;
    (iVar16._M_current)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f59c440;
    (iVar16._M_current)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
    iVar16._M_current =
         local_208.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    local_208.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar16._M_current;
  }
  local_188 = (undefined1  [8])0x3f59c440;
  iStack_180._M_current._0_4_ = 0.5257311;
  if (iVar16._M_current ==
      local_208.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_208,iVar16,(vec<3,_float,_(glm::qualifier)0> *)local_188);
    iVar16._M_current =
         local_208.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    ((iVar16._M_current)->field_2).z = 0.5257311;
    (iVar16._M_current)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f59c440;
    (iVar16._M_current)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
    iVar16._M_current =
         local_208.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    local_208.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar16._M_current;
  }
  local_188 = (undefined1  [8])0xbf06965000000000;
  iStack_180._M_current._0_4_ = -0.8506508;
  if (iVar16._M_current ==
      local_208.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_208,iVar16,(vec<3,_float,_(glm::qualifier)0> *)local_188);
    iVar16._M_current =
         local_208.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    ((iVar16._M_current)->field_2).z = -0.8506508;
    (iVar16._M_current)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    (iVar16._M_current)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0xbf069650;
    iVar16._M_current =
         local_208.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    local_208.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar16._M_current;
  }
  local_188 = (undefined1  [8])0xbf06965000000000;
  iStack_180._M_current._0_4_ = 0.8506508;
  if (iVar16._M_current ==
      local_208.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_208,iVar16,(vec<3,_float,_(glm::qualifier)0> *)local_188);
    iVar16._M_current =
         local_208.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    ((iVar16._M_current)->field_2).z = 0.8506508;
    (iVar16._M_current)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    (iVar16._M_current)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0xbf069650;
    iVar16._M_current =
         local_208.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    local_208.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar16._M_current;
  }
  local_188 = (undefined1  [8])0xbf59c440bf069650;
  iStack_180._M_current._0_4_ = 0.0;
  if (iVar16._M_current ==
      local_208.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_208,iVar16,(vec<3,_float,_(glm::qualifier)0> *)local_188);
    iVar16._M_current =
         local_208.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    ((iVar16._M_current)->field_2).z = 0.0;
    (iVar16._M_current)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbf069650;
    (iVar16._M_current)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0xbf59c440;
    iVar16._M_current =
         local_208.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    local_208.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar16._M_current;
  }
  local_188 = (undefined1  [8])0xbf59c4403f069650;
  iStack_180._M_current =
       (vec<2,_float,_(glm::qualifier)0> *)((ulong)iStack_180._M_current._4_4_ << 0x20);
  local_88 = __return_storage_ptr__;
  if (iVar16._M_current ==
      local_208.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&local_208,iVar16,(vec<3,_float,_(glm::qualifier)0> *)local_188);
  }
  else {
    ((iVar16._M_current)->field_2).z = 0.0;
    (iVar16._M_current)->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f069650;
    (iVar16._M_current)->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0xbf59c440;
    local_208.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_208.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  memcpy(local_188,&DAT_002e2d10,0xf0);
  __l._M_len = 0x3c;
  __l._M_array = (iterator)local_188;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1b8,__l,(allocator_type *)&local_1e8);
  if (_iterations != 0) {
    uVar15 = (long)local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start >> 2;
    sVar22 = 0;
    local_80 = _iterations;
    do {
      uVar15 = uVar15 << 2;
      local_188 = (undefined1  [8])0x0;
      iStack_180._M_current = (pointer)0x0;
      local_178 = (pointer)0x0;
      if (uVar15 < 0xc) {
        pvVar12 = (pointer)0x0;
        auVar26 = (undefined1  [8])(pointer)0x0;
        iVar28._M_current = (pointer)0x0;
      }
      else {
        uVar13 = uVar15 / 0xc;
        lVar23 = 8;
        local_78 = sVar22;
        local_70 = uVar15;
        do {
          aVar14 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                    ((long)&((pointer)
                            ((long)local_1b8.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + -8))->field_0 + lVar23
                    );
          local_1c8[0] = aVar14;
          aVar21 = *(anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 *)
                    ((long)local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar23 + -4);
          local_198[0] = aVar21;
          local_190 = *(uint *)((long)(anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3
                                       *)local_1b8.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar23);
          pvVar20 = local_208.
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pvVar10 = local_208.
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          local_18c = local_208.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(uint)aVar14].field_2.z;
          local_48._0_4_ =
               *(float *)&local_208.
                          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(uint)aVar21].field_0;
          local_48._4_4_ =
               *(float *)&local_208.
                          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(uint)aVar21].field_1;
          local_1cc = local_208.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(uint)aVar21].field_2.z;
          local_58._0_4_ =
               *(float *)&local_208.
                          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(uint)aVar14].field_0;
          local_58._4_4_ =
               *(float *)&local_208.
                          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(uint)aVar14].field_1;
          uVar2 = local_208.
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_190].field_0;
          uVar4 = local_208.
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_190].field_1;
          local_98._4_4_ = uVar4;
          local_98._0_4_ = uVar2;
          _uStack_90 = 0;
          local_1d0 = local_208.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_190].field_2.z;
          fVar25 = local_18c + local_1cc;
          uStack_50 = 0;
          uStack_40 = 0;
          fVar29 = (float)local_58 + (float)local_48;
          fVar30 = local_58._4_4_ + local_48._4_4_;
          fVar31 = 1.0 / SQRT(fVar30 * fVar30 + fVar29 * fVar29 + fVar25 * fVar25);
          aStack_1e4.y = fVar31 * fVar30;
          local_1e8.x = fVar31 * fVar29;
          if (local_208.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_208.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            aStack_1e0.z = fVar25 * fVar31;
            std::
            vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
            ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
                      ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                        *)&local_208,
                       (iterator)
                       local_208.
                       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (vec<3,_float,_(glm::qualifier)0> *)&local_1e8);
            iVar16._M_current =
                 local_208.
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            ((local_208.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->field_2).z = fVar25 * fVar31;
            (local_208.
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(fVar31 * fVar29);
            (local_208.
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->field_1 =
                 (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(fVar31 * fVar30);
            local_208.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_208.
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            iVar16._M_current =
                 local_208.
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          }
          fVar29 = local_1cc + local_1d0;
          fVar30 = (float)local_48 + (float)local_98._0_4_;
          fVar31 = local_48._4_4_ + (float)local_98._4_4_;
          fVar25 = 1.0 / SQRT(fVar31 * fVar31 + fVar30 * fVar30 + fVar29 * fVar29);
          aStack_1e0.z = fVar29 * fVar25;
          aStack_1e4.y = fVar25 * fVar31;
          local_1e8.x = fVar25 * fVar30;
          if (iVar16._M_current ==
              local_208.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
            ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
                      ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                        *)&local_208,iVar16,(vec<3,_float,_(glm::qualifier)0> *)&local_1e8);
            iVar16._M_current =
                 local_208.
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            ((iVar16._M_current)->field_2).z = (float)aStack_1e0;
            (iVar16._M_current)->field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(fVar25 * fVar30);
            (iVar16._M_current)->field_1 =
                 (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(fVar25 * fVar31);
            iVar16._M_current =
                 local_208.
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            local_208.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar16._M_current;
          }
          fVar30 = (float)local_58 + (float)local_98._0_4_;
          fVar31 = local_58._4_4_ + (float)local_98._4_4_;
          fVar29 = local_18c + local_1d0;
          fVar25 = 1.0 / SQRT(fVar31 * fVar31 + fVar30 * fVar30 + fVar29 * fVar29);
          aStack_1e4.y = fVar25 * fVar31;
          local_1e8.x = fVar25 * fVar30;
          _aStack_1e0 = (vec<2,_float,_(glm::qualifier)0>)CONCAT44(aStack_1dc,fVar29 * fVar25);
          if (iVar16._M_current ==
              local_208.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
            ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
                      ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                        *)&local_208,iVar16,(vec<3,_float,_(glm::qualifier)0> *)&local_1e8);
          }
          else {
            ((iVar16._M_current)->field_2).z = fVar29 * fVar25;
            (iVar16._M_current)->field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(fVar25 * fVar30);
            (iVar16._M_current)->field_1 =
                 (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(fVar25 * fVar31);
            local_208.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_208.
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          if (iStack_180._M_current == local_178) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_188,
                       (iterator)iStack_180._M_current,(uint *)local_1c8);
          }
          else {
            *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)iStack_180._M_current
                 = local_1c8[0];
            iStack_180._M_current = iStack_180._M_current + 4;
          }
          aVar14 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
                   ((int)((long)pvVar10 - (long)pvVar20 >> 2) * -0x55555555);
          if (iStack_180._M_current == local_178) {
            local_1e8 = aVar14;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188,
                       (iterator)iStack_180._M_current,(uint *)&local_1e8);
          }
          else {
            *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)iStack_180._M_current
                 = aVar14;
            iStack_180._M_current = iStack_180._M_current + 4;
          }
          aVar21 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)((int)aVar14 + 2)
          ;
          local_1e8 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)aVar21;
          if (iStack_180._M_current == local_178) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188,
                       (iterator)iStack_180._M_current,(uint *)&local_1e8);
          }
          else {
            (iStack_180._M_current)->field_0 = aVar21;
            iStack_180._M_current = iStack_180._M_current + 4;
          }
          if (iStack_180._M_current == local_178) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_188,
                       (iterator)iStack_180._M_current,(uint *)local_198);
          }
          else {
            (iStack_180._M_current)->field_0 = local_198[0];
            iStack_180._M_current = iStack_180._M_current + 4;
          }
          aVar19 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)((int)aVar14 + 1)
          ;
          if (iStack_180._M_current == local_178) {
            local_1e8 = aVar19;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188,
                       (iterator)iStack_180._M_current,(uint *)&local_1e8);
          }
          else {
            *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)iStack_180._M_current
                 = aVar19;
            iStack_180._M_current = iStack_180._M_current + 4;
          }
          local_1e8 = aVar14;
          if (iStack_180._M_current == local_178) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188,
                       (iterator)iStack_180._M_current,(uint *)&local_1e8);
          }
          else {
            *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)iStack_180._M_current
                 = aVar14;
            iStack_180._M_current = iStack_180._M_current + 4;
          }
          if (iStack_180._M_current == local_178) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_188,
                       (iterator)iStack_180._M_current,&local_190);
          }
          else {
            *(uint *)iStack_180._M_current = local_190;
            iStack_180._M_current = iStack_180._M_current + 4;
          }
          if (iStack_180._M_current == local_178) {
            local_1e8 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)aVar21;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188,
                       (iterator)iStack_180._M_current,(uint *)&local_1e8);
          }
          else {
            (iStack_180._M_current)->field_0 = aVar21;
            iStack_180._M_current = iStack_180._M_current + 4;
          }
          if (iStack_180._M_current == local_178) {
            local_1e8 = aVar19;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188,
                       (iterator)iStack_180._M_current,(uint *)&local_1e8);
          }
          else {
            *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)iStack_180._M_current
                 = aVar19;
            iStack_180._M_current = iStack_180._M_current + 4;
          }
          if (iStack_180._M_current == local_178) {
            local_1e8 = aVar14;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188,
                       (iterator)iStack_180._M_current,(uint *)&local_1e8);
          }
          else {
            *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)iStack_180._M_current
                 = aVar14;
            iStack_180._M_current = iStack_180._M_current + 4;
          }
          if (iStack_180._M_current == local_178) {
            local_1e8 = aVar19;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188,
                       (iterator)iStack_180._M_current,(uint *)&local_1e8);
          }
          else {
            *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)iStack_180._M_current
                 = aVar19;
            iStack_180._M_current = iStack_180._M_current + 4;
          }
          local_1e8 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)aVar21;
          if (iStack_180._M_current == local_178) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188,
                       (iterator)iStack_180._M_current,(uint *)&local_1e8);
          }
          else {
            (iStack_180._M_current)->field_0 = aVar21;
            iStack_180._M_current = iStack_180._M_current + 4;
          }
          lVar23 = lVar23 + 0xc;
          uVar13 = uVar13 - 1;
          pvVar12 = local_178;
          uVar15 = local_70;
          _iterations = local_80;
          sVar22 = local_78;
          auVar26 = local_188;
          iVar28._M_current = iStack_180._M_current;
        } while (uVar13 != 0);
      }
      puVar11 = local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_188 = (undefined1  [8])
                  local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      iStack_180._M_current =
           (vec<2,_float,_(glm::qualifier)0> *)
           local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_178 = (pointer)local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      bVar24 = (pointer)local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0;
      local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)auVar26;
      local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)iVar28._M_current;
      local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pvVar12;
      if (bVar24) {
        operator_delete(puVar11);
      }
      sVar22 = sVar22 + 1;
    } while (sVar22 != _iterations);
  }
  local_188 = (undefined1  [8])0x0;
  iStack_180._M_current = (vec<2,_float,_(glm::qualifier)0> *)0x0;
  local_178 = (vec<2,_float,_(glm::qualifier)0> *)0x0;
  if (local_208.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_208.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar23 = 8;
    uVar15 = 0;
    pvVar20 = local_208.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      fVar25 = *(float *)((long)pvVar20 + lVar23 + -8);
      fVar29 = *(float *)((long)&pvVar20->field_0 + lVar23);
      local_1d0 = SQRT(fVar25 * fVar25 + fVar29 * fVar29);
      local_98._0_4_ = atan2f(fVar29,fVar25);
      local_98._4_4_ = extraout_XMM0_Db;
      uStack_90 = extraout_XMM0_Dc;
      uStack_8c = extraout_XMM0_Dd;
      fVar25 = atan2f(*(float *)((long)pvVar20 + lVar23 + -4),local_1d0);
      auVar27._0_8_ = (double)(float)local_98._0_4_;
      auVar27._8_8_ = (double)fVar25;
      auVar27 = divpd(auVar27,_DAT_002e2c40);
      aStack_1e4.y = 1.0 - (float)(auVar27._8_8_ + 0.5);
      local_1e8.x = 1.0 - (float)(auVar27._0_8_ + 0.5);
      if (iStack_180._M_current == local_178) {
        std::
        vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
        ::_M_realloc_insert<glm::vec<2,float,(glm::qualifier)0>>
                  ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                    *)local_188,iStack_180,(vec<2,_float,_(glm::qualifier)0> *)&local_1e8);
      }
      else {
        *iStack_180._M_current = _local_1e8;
        iStack_180._M_current = iStack_180._M_current + 1;
      }
      uVar15 = uVar15 + 1;
      lVar23 = lVar23 + 0xc;
      pvVar20 = local_208.
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)(((long)local_208.
                                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_208.
                                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2) *
                             -0x5555555555555555));
  }
  local_1e8 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  aStack_1e4 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  aStack_1e0 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x0;
  aStack_1dc = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  local_1d8.field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  local_1d8.field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  if (8 < (ulong)((long)local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start)) {
    lVar23 = 0;
    uVar15 = 0;
    do {
      aVar14 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                ((long)(anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 *)
                       local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar23);
      fVar25 = (((pointer)((long)local_188 + (ulong)(uint)aVar14 * 8))->field_0).x;
      local_1d0 = (((pointer)
                   ((long)local_188 +
                   (ulong)*(uint *)((long)((long)local_1b8.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + 4) +
                                   lVar23) * 8))->field_0).x;
      aVar19 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                ((long)&((pointer)
                        ((long)local_1b8.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + 8))->field_0 + lVar23);
      _local_98 = ZEXT416((uint)(((pointer)((long)local_188 + (ulong)(uint)aVar19 * 8))->field_0).x)
      ;
      if (0.5 < ABS((((pointer)((long)local_188 + (ulong)(uint)aVar19 * 8))->field_0).x - fVar25)) {
        local_1cc = fVar25;
        if (0.5 <= fVar25) {
          local_1c8[0] = aVar19;
          if (_aStack_1e0 != local_1d8) {
            *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)_aStack_1e0 = aVar19;
            goto LAB_00210f3e;
          }
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)&local_1e8,(iterator)_aStack_1e0,
                     (int *)local_1c8);
          fVar25 = local_1cc;
        }
        else {
          local_1c8[0] = aVar14;
          if (_aStack_1e0 == local_1d8) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)&local_1e8,(iterator)_aStack_1e0,
                       (int *)local_1c8);
            fVar25 = local_1cc;
          }
          else {
            *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)_aStack_1e0 = aVar14;
LAB_00210f3e:
            _aStack_1e0 = (vec<2,_float,_(glm::qualifier)0>)((long)_aStack_1e0 + 4);
          }
        }
      }
      if (0.5 < ABS(local_1d0 - fVar25)) {
        if (0.5 <= fVar25) {
          aVar14 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                    ((long)((long)local_1b8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 4) + lVar23);
          local_1c8[0] = aVar14;
          if (_aStack_1e0 != local_1d8) goto LAB_00210fca;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)&local_1e8,(iterator)_aStack_1e0,
                     (int *)local_1c8);
        }
        else {
          aVar14 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                    ((long)(anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 *)
                           local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar23);
          local_1c8[0] = aVar14;
          if (_aStack_1e0 == local_1d8) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)&local_1e8,(iterator)_aStack_1e0,
                       (int *)local_1c8);
          }
          else {
LAB_00210fca:
            *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)_aStack_1e0 = aVar14;
            _aStack_1e0 = (vec<2,_float,_(glm::qualifier)0>)((long)_aStack_1e0 + 4);
          }
        }
      }
      if (0.5 < ABS((float)local_98._0_4_ - local_1d0)) {
        if (0.5 <= local_1d0) {
          aVar14 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                    ((long)&((pointer)
                            ((long)local_1b8.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + 8))->field_0 + lVar23)
          ;
          local_1c8[0] = aVar14;
          if (_aStack_1e0 != local_1d8) goto LAB_00211059;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)&local_1e8,(iterator)_aStack_1e0,
                     (int *)local_1c8);
        }
        else {
          aVar14 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                    ((long)((long)local_1b8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 4) + lVar23);
          local_1c8[0] = aVar14;
          if (_aStack_1e0 == local_1d8) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)&local_1e8,(iterator)_aStack_1e0,
                       (int *)local_1c8);
          }
          else {
LAB_00211059:
            *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)_aStack_1e0 = aVar14;
            _aStack_1e0 = (vec<2,_float,_(glm::qualifier)0>)((long)_aStack_1e0 + 4);
          }
        }
      }
      uVar15 = uVar15 + 1;
      lVar23 = lVar23 + 0xc;
    } while (uVar15 < (ulong)((long)local_1b8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1b8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2) / 3);
    if (_aStack_1e0 != _local_1e8) {
      uVar15 = 0;
      do {
        uVar5 = *(uint *)((long)_local_1e8 + uVar15 * 4);
        local_1c8[0] = local_208.
                       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar5].field_0;
        local_1c8[1] = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                        &local_208.
                         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar5].field_1;
        local_1c0 = local_208.
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar5].field_2;
        local_198[0].x = (*(pointer)((long)local_188 + (ulong)uVar5 * 8)).field_0.x + 1.0;
        local_198[1].x = (*(pointer)((long)local_188 + (ulong)uVar5 * 8)).field_1.y + 0.0;
        if (local_208.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_208.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
          ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                    ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                      *)&local_208,
                     (iterator)
                     local_208.
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (vec<3,_float,_(glm::qualifier)0> *)local_1c8);
        }
        else {
          pvVar20 = local_208.
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar5;
          aVar14 = pvVar20->field_0;
          aVar9 = pvVar20->field_1;
          (local_208.
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->field_2 = pvVar20->field_2;
          (local_208.
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->field_0 = aVar14;
          (local_208.
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->field_1 = aVar9;
          local_208.
          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_208.
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if (iStack_180._M_current == local_178) {
          std::
          vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
          ::_M_realloc_insert<glm::vec<2,float,(glm::qualifier)0>const&>
                    ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                      *)local_188,iStack_180,(vec<2,_float,_(glm::qualifier)0> *)local_198);
        }
        else {
          (iStack_180._M_current)->field_0 = local_198[0];
          (iStack_180._M_current)->field_1 =
               (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)local_198[1];
          iStack_180._M_current = iStack_180._M_current + 1;
        }
        if ((long)local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          lVar23 = (long)local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2;
          pvVar12 = (pointer)((long)local_1b8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 8);
          uVar13 = 2;
          uVar17 = 1;
          uVar18 = 0;
          do {
            auVar6._8_8_ = 0;
            auVar6._0_8_ = uVar18;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = uVar13;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = uVar17;
            if ((*(uint *)((long)local_1b8.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + uVar17 * 4 + -4) ==
                 uVar5) &&
               ((lVar1 = (SUB168(auVar6 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffcU)
                         * 3,
                0.5 < (((pointer)
                       ((long)local_188 +
                       (ulong)*(uint *)((long)local_1b8.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start +
                                       uVar17 * 4 +
                                       lVar1 + (SUB168(auVar8 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 &
                                               0xfffffffffffffffcU) * -3) * 8))->field_0).x ||
                (0.5 < (((pointer)
                        ((long)local_188 +
                        (ulong)*(uint *)((long)pvVar12 +
                                        lVar1 + (SUB168(auVar7 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2
                                                & 0xfffffffffffffffcU) * -3) * 8))->field_0).x)))) {
              *(int *)((long)local_1b8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + uVar17 * 4 + -4) =
                   (int)((ulong)((long)local_208.
                                       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_208.
                                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555
                   + -1;
            }
            pvVar12 = (pointer)&pvVar12->field_1;
            uVar13 = uVar13 + 1;
            lVar1 = (-(ulong)(lVar23 == 0) - lVar23) + uVar17;
            uVar17 = uVar17 + 1;
            uVar18 = uVar18 + 1;
          } while (lVar1 != 0);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 < (ulong)((long)_aStack_1e0 - (long)_local_1e8 >> 2));
    }
  }
  this = local_88;
  Mesh::Mesh(local_88);
  Mesh::addNormals(this,&local_208);
  Mesh::addTexCoords(this,(vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                           *)local_188);
  if (local_208.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_208.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar23 = 8;
    uVar15 = 0;
    do {
      uVar3 = *(undefined8 *)
               ((long)local_208.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar23 + -8);
      *(ulong *)((long)local_208.
                       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar23 + -8) =
           CONCAT44((float)((ulong)uVar3 >> 0x20) * local_68,(float)uVar3 * local_68);
      *(float *)((long)&(local_208.
                         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar23) =
           *(float *)((long)&(local_208.
                              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar23) *
           local_68;
      uVar15 = uVar15 + 1;
      lVar23 = lVar23 + 0xc;
    } while (uVar15 < (ulong)(((long)local_208.
                                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_208.
                                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2) *
                             -0x5555555555555555));
  }
  Mesh::addVertices(this,&local_208);
  Mesh::addIndices(this,&local_1b8);
  Mesh::computeTangents(this);
  if (_local_1e8 != (vec<2,_float,_(glm::qualifier)0>)0x0) {
    operator_delete((void *)_local_1e8);
  }
  if (local_188 != (undefined1  [8])0x0) {
    operator_delete((void *)local_188);
  }
  if ((pointer)local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_208.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return this;
}

Assistant:

Mesh icosphereMesh(float _radius, size_t _iterations) {

    /// Step 1 : Generate icosahedron
    const float sqrt5 = sqrt(5.0f);
    const float phi = (1.0f + sqrt5) * 0.5f;
    const float invnorm = 1/sqrt(phi*phi+1);

    std::vector<glm::vec3> vertices;
    vertices.push_back(invnorm * glm::vec3(-1,  phi, 0));//0
    vertices.push_back(invnorm * glm::vec3( 1,  phi, 0));//1
    vertices.push_back(invnorm * glm::vec3(0,   1,  -phi));//2
    vertices.push_back(invnorm * glm::vec3(0,   1,   phi));//3
    vertices.push_back(invnorm * glm::vec3(-phi,0,  -1));//4
    vertices.push_back(invnorm * glm::vec3(-phi,0,   1));//5
    vertices.push_back(invnorm * glm::vec3( phi,0,  -1));//6
    vertices.push_back(invnorm * glm::vec3( phi,0,   1));//7
    vertices.push_back(invnorm * glm::vec3(0,   -1, -phi));//8
    vertices.push_back(invnorm * glm::vec3(0,   -1,  phi));//9
    vertices.push_back(invnorm * glm::vec3(-1,  -phi,0));//10
    vertices.push_back(invnorm * glm::vec3( 1,  -phi,0));//11
       
    std::vector<INDEX_TYPE> indices = {
        0,1,2,
        0,3,1,
        0,4,5,
        1,7,6,
        1,6,2,
        1,3,7,
        0,2,4,
        0,5,3,
        2,6,8,
        2,8,4,
        3,5,9,
        3,9,7,
        11,6,7,
        10,5,4,
        10,4,8,
        10,9,5,
        11,8,6,
        11,7,9,
        10,8,11,
        10,11,9
    };

    size_t size = indices.size();

    /// Step 2 : tessellate
    for (size_t iteration = 0; iteration < _iterations; iteration++) {
        size*=4;
        std::vector<INDEX_TYPE> newFaces;
        for (size_t i = 0; i < size/12; i++) {
            INDEX_TYPE i1 = indices[i*3];
            INDEX_TYPE i2 = indices[i*3+1];
            INDEX_TYPE i3 = indices[i*3+2];
            size_t i12 = vertices.size();
            size_t i23 = i12+1;
            size_t i13 = i12+2;
            glm::vec3 v1 = vertices[i1];
            glm::vec3 v2 = vertices[i2];
            glm::vec3 v3 = vertices[i3];
            //make 1 vertice at the center of each edge and project it onto the sphere
            vertices.push_back(glm::normalize(v1+v2));
            vertices.push_back(glm::normalize(v2+v3));
            vertices.push_back(glm::normalize(v1+v3));
            //now recreate indices
            newFaces.push_back(i1);
            newFaces.push_back(i12);
            newFaces.push_back(i13);
            newFaces.push_back(i2);
            newFaces.push_back(i23);
            newFaces.push_back(i12);
            newFaces.push_back(i3);
            newFaces.push_back(i13);
            newFaces.push_back(i23);
            newFaces.push_back(i12);
            newFaces.push_back(i23);
            newFaces.push_back(i13);
        }
        indices.swap(newFaces);
    }

    /// Step 3 : generate texcoords
    std::vector<glm::vec2> texCoords;
    for (size_t i = 0; i < vertices.size(); i++) {
        const auto& vec = vertices[i];
        float u, v;
        float r0 = sqrtf(vec.x*vec.x+vec.z*vec.z);
        float alpha;
        alpha = atan2f(vec.z,vec.x);
        u = alpha/TAU+.5f;
        v = atan2f(vec.y, r0)/PI + .5f;
        // reverse the u coord, so the default is texture mapped left to
        // right on the outside of a sphere 
        // reverse the v coord, so that texture origin is at top left
        texCoords.push_back(glm::vec2(1.0-u,1.f-v));
    }

    /// Step 4 : fix texcoords
    // find vertices to split
    std::vector<int> indexToSplit;

    for (size_t i=0; i<indices.size()/3; i++) {
        glm::vec2 t0 = texCoords[indices[i*3+0]];
        glm::vec2 t1 = texCoords[indices[i*3+1]];
        glm::vec2 t2 = texCoords[indices[i*3+2]];

        if (std::abs(t2.x-t0.x)>0.5) {
            if (t0.x<0.5)
                indexToSplit.push_back(indices[i*3]);
            else
                indexToSplit.push_back(indices[i*3+2]);
        }
        if (std::abs(t1.x-t0.x)>0.5) {
            if (t0.x<0.5)
                indexToSplit.push_back(indices[i*3]);
            else
                indexToSplit.push_back(indices[i*3+1]);
        }
        if (std::abs(t2.x-t1.x)>0.5) {
            if (t1.x<0.5)
                indexToSplit.push_back(indices[i*3+1]);
            else
                indexToSplit.push_back(indices[i*3+2]);
        }
    }

    //split vertices
    for (size_t i = 0; i < indexToSplit.size(); i++) {
        INDEX_TYPE index = indexToSplit[i];
        //duplicate vertex
        glm::vec3 v = vertices[index];
        glm::vec2 t = texCoords[index] + glm::vec2(1.f, 0.f);
        vertices.push_back(v);
        texCoords.push_back(t);
        size_t newIndex = vertices.size()-1;
        //reassign indices
        for (size_t j = 0; j<indices.size(); j++) {
            if (indices[j] == index) {
                INDEX_TYPE index1 = indices[(j+1)%3+(j/3)*3];
                INDEX_TYPE index2 = indices[(j+2)%3+(j/3)*3];
                if ((texCoords[index1].x>0.5) || (texCoords[index2].x>0.5))
                    indices[j] = newIndex;
            }
        }
    }

    Mesh mesh;
    mesh.addNormals( vertices );
    mesh.addTexCoords( texCoords );

    for (size_t i = 0; i < vertices.size(); i++ )
        vertices[i] *= _radius;

    mesh.addVertices( vertices );
    mesh.addIndices( indices );
    mesh.computeTangents();

    return  mesh;
}